

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

_Bool victim_tlb_hit(CPUArchState_conflict30 *env,size_t mmu_idx,size_t index,size_t elt_ofs,
                    target_ulong_conflict page)

{
  undefined8 *puVar1;
  target_ulong_conflict tVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  target_ulong_conflict *ptVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 *puVar25;
  _Bool _Var26;
  CPUIOTLBEntry tmpio;
  CPUTLBEntry tmptlb;
  
  lVar24 = mmu_idx * 0x2b0;
  if (*(target_ulong_conflict *)((long)env + elt_ofs + lVar24 + -0x828) == page) {
    puVar25 = (undefined8 *)((long)env + lVar24 + -0x828);
    _Var26 = true;
    lVar22 = 0;
  }
  else {
    puVar25 = (undefined8 *)((long)env + lVar24 + -0x828);
    ptVar20 = (target_ulong_conflict *)((long)env + lVar24 + elt_ofs + -0x7e8);
    uVar19 = 0xffffffffffffffff;
    do {
      uVar21 = uVar19;
      if (uVar21 == 6) {
        return false;
      }
      puVar25 = puVar25 + 8;
      tVar2 = *ptVar20;
      ptVar20 = ptVar20 + 0x10;
      uVar19 = uVar21 + 1;
    } while (tVar2 != page);
    _Var26 = uVar21 + 1 < 7;
    lVar22 = uVar21 + 2;
  }
  lVar3 = *(long *)(env->gpr_a + mmu_idx * 4 + -0xe);
  lVar23 = index * 0x40;
  uVar4 = *(undefined8 *)(lVar3 + lVar23);
  uVar5 = ((undefined8 *)(lVar3 + lVar23))[1];
  puVar1 = (undefined8 *)(lVar3 + lVar23 + 0x10);
  uVar6 = *puVar1;
  uVar7 = puVar1[1];
  puVar1 = (undefined8 *)(lVar3 + lVar23 + 0x20);
  uVar8 = *puVar1;
  uVar9 = puVar1[1];
  puVar1 = (undefined8 *)(lVar3 + lVar23 + 0x30);
  uVar10 = *puVar1;
  uVar11 = puVar1[1];
  uVar12 = *puVar25;
  uVar13 = puVar25[1];
  uVar14 = puVar25[2];
  uVar15 = puVar25[3];
  uVar16 = puVar25[4];
  uVar17 = puVar25[5];
  uVar18 = puVar25[7];
  puVar1 = (undefined8 *)(lVar3 + lVar23 + 0x30);
  *puVar1 = puVar25[6];
  puVar1[1] = uVar18;
  puVar1 = (undefined8 *)(lVar3 + lVar23 + 0x20);
  *puVar1 = uVar16;
  puVar1[1] = uVar17;
  puVar1 = (undefined8 *)(lVar3 + lVar23 + 0x10);
  *puVar1 = uVar14;
  puVar1[1] = uVar15;
  *(undefined8 *)(lVar3 + lVar23) = uVar12;
  ((undefined8 *)(lVar3 + lVar23))[1] = uVar13;
  puVar25[6] = uVar10;
  puVar25[7] = uVar11;
  puVar25[4] = uVar8;
  puVar25[5] = uVar9;
  puVar25[2] = uVar6;
  puVar25[3] = uVar7;
  *puVar25 = uVar4;
  puVar25[1] = uVar5;
  lVar3 = *(long *)((long)env + lVar24 + -0x5a8);
  puVar25 = (undefined8 *)(lVar3 + index * 0x10);
  uVar4 = *puVar25;
  uVar5 = puVar25[1];
  puVar1 = (undefined8 *)((long)env + lVar22 * 0x10 + 0x228 + lVar24 + -0x850);
  uVar6 = puVar1[1];
  puVar25 = (undefined8 *)(lVar3 + index * 0x10);
  *puVar25 = *puVar1;
  puVar25[1] = uVar6;
  puVar25 = (undefined8 *)((long)env + lVar22 * 0x10 + 0x228 + lVar24 + -0x850);
  *puVar25 = uVar4;
  puVar25[1] = uVar5;
  return _Var26;
}

Assistant:

static bool victim_tlb_hit(CPUArchState *env, size_t mmu_idx, size_t index,
                           size_t elt_ofs, target_ulong page)
{
    size_t vidx;

    // assert_cpu_is_self(env_cpu(env));
    for (vidx = 0; vidx < CPU_VTLB_SIZE; ++vidx) {
        CPUTLBEntry *vtlb = &env_tlb(env)->d[mmu_idx].vtable[vidx];
        target_ulong cmp;

#if TCG_OVERSIZED_GUEST
        cmp = *(target_ulong *)((uintptr_t)vtlb + elt_ofs);
#else
        cmp = *(target_ulong *)((uintptr_t)vtlb + elt_ofs);
#endif

        if (cmp == page) {
            /* Found entry in victim tlb, swap tlb and iotlb.  */
            CPUTLBEntry tmptlb, *tlb = &env_tlb(env)->f[mmu_idx].table[index];

            copy_tlb_helper_locked(&tmptlb, tlb);
            copy_tlb_helper_locked(tlb, vtlb);
            copy_tlb_helper_locked(vtlb, &tmptlb);

            CPUIOTLBEntry tmpio, *io = &env_tlb(env)->d[mmu_idx].iotlb[index];
            CPUIOTLBEntry *vio = &env_tlb(env)->d[mmu_idx].viotlb[vidx];
            tmpio = *io; *io = *vio; *vio = tmpio;
            return true;
        }
    }
    return false;
}